

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

void __thiscall
clickhouse::Client::Impl::WriteBlock(Impl *this,Block *block,CodedOutputStream *output)

{
  bool bVar1;
  element_type *peVar2;
  string *in_RDX;
  Block *in_RSI;
  long in_RDI;
  Iterator bi;
  Type *in_stack_00000448;
  int *in_stack_ffffffffffffff38;
  Iterator *in_stack_ffffffffffffff40;
  string *value;
  Iterator *output_00;
  Iterator local_78 [3];
  string local_48 [32];
  Iterator local_28;
  string *local_18;
  Block *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (0xcabe < *(ulong *)(in_RDI + 0x230)) {
    WireFormat::WriteUInt64
              ((CodedOutputStream *)in_stack_ffffffffffffff40,(uint64_t)in_stack_ffffffffffffff38);
    Block::Info(local_10);
    WireFormat::WriteFixed<unsigned_char>
              ((CodedOutputStream *)in_stack_ffffffffffffff40,(uchar *)in_stack_ffffffffffffff38);
    WireFormat::WriteUInt64
              ((CodedOutputStream *)in_stack_ffffffffffffff40,(uint64_t)in_stack_ffffffffffffff38);
    Block::Info(local_10);
    WireFormat::WriteFixed<int>
              ((CodedOutputStream *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    WireFormat::WriteUInt64
              ((CodedOutputStream *)in_stack_ffffffffffffff40,(uint64_t)in_stack_ffffffffffffff38);
  }
  Block::GetColumnCount((Block *)0x24eaa9);
  WireFormat::WriteUInt64
            ((CodedOutputStream *)in_stack_ffffffffffffff40,(uint64_t)in_stack_ffffffffffffff38);
  Block::GetRowCount(local_10);
  WireFormat::WriteUInt64
            ((CodedOutputStream *)in_stack_ffffffffffffff40,(uint64_t)in_stack_ffffffffffffff38);
  Block::Iterator::Iterator(&local_28,local_10);
  while( true ) {
    bVar1 = Block::Iterator::IsValid(in_stack_ffffffffffffff40);
    if (!bVar1) break;
    output_00 = &local_28;
    value = local_18;
    Block::Iterator::Name_abi_cxx11_((Iterator *)0x24eb27);
    WireFormat::WriteString((CodedOutputStream *)output_00,value);
    Block::Iterator::Type((Iterator *)value);
    std::__shared_ptr_access<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x24eb5f);
    Type::GetName_abi_cxx11_(in_stack_00000448);
    WireFormat::WriteString((CodedOutputStream *)output_00,value);
    std::__cxx11::string::~string(local_48);
    std::shared_ptr<clickhouse::Type>::~shared_ptr((shared_ptr<clickhouse::Type> *)0x24eb9c);
    in_stack_ffffffffffffff40 = local_78;
    Block::Iterator::Column((Iterator *)value);
    peVar2 = std::__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x24ebbd);
    (*peVar2->_vptr_Column[4])(peVar2,local_18);
    std::shared_ptr<clickhouse::Column>::~shared_ptr((shared_ptr<clickhouse::Column> *)0x24ebdd);
    Block::Iterator::Next(&local_28);
  }
  return;
}

Assistant:

void Client::Impl::WriteBlock(const Block& block, CodedOutputStream* output) {
    // Additional information about block.
    if (server_info_.revision >= DBMS_MIN_REVISION_WITH_BLOCK_INFO) {
        WireFormat::WriteUInt64(output, 1);
        WireFormat::WriteFixed (output, block.Info().is_overflows);
        WireFormat::WriteUInt64(output, 2);
        WireFormat::WriteFixed (output, block.Info().bucket_num);
        WireFormat::WriteUInt64(output, 0);
    }

    WireFormat::WriteUInt64(output, block.GetColumnCount());
    WireFormat::WriteUInt64(output, block.GetRowCount());

    for (Block::Iterator bi(block); bi.IsValid(); bi.Next()) {
        WireFormat::WriteString(output, bi.Name());
        WireFormat::WriteString(output, bi.Type()->GetName());

        bi.Column()->Save(output);
    }
}